

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fib-lace.c
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  uint arg_1;
  uint uVar3;
  double dVar4;
  double dVar5;
  double t2;
  int m;
  double t1;
  int n;
  uint uStack_1c;
  char c;
  int dqsize;
  int workers;
  char **argv_local;
  int argc_local;
  
  uStack_1c = 1;
  n = 100000;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar2 = getopt(argc,argv,"w:q:h");
        cVar1 = (char)iVar2;
        if (cVar1 == -1) {
          if (_optind != argc) {
            lace_start(uStack_1c,(long)n);
            arg_1 = atoi(argv[_optind]);
            dVar4 = wctime();
            uVar3 = pfib_RUN(arg_1);
            dVar5 = wctime();
            printf("fib(%d) = %d\n",(ulong)arg_1,(ulong)uVar3);
            printf("Time: %f\n",dVar5 - dVar4);
            lace_stop();
            return 0;
          }
          usage(*argv);
          exit(1);
        }
        if (cVar1 != 'h') break;
        usage(*argv);
      }
      if (cVar1 != 'q') break;
      n = atoi(_optarg);
    }
    if (cVar1 != 'w') break;
    uStack_1c = atoi(_optarg);
  }
  abort();
}

Assistant:

int main(int argc, char **argv)
{
    int workers = 1;
    int dqsize = 100000;

    char c;
    while ((c=getopt(argc, argv, "w:q:h")) != -1) {
        switch (c) {
            case 'w':
                workers = atoi(optarg);
                break;
            case 'q':
                dqsize = atoi(optarg);
                break;
            case 'h':
                usage(argv[0]);
                break;
            default:
                abort();
        }
    }

    if (optind == argc) {
        usage(argv[0]);
        exit(1);
    }

    lace_start(workers, dqsize);

    int n = atoi(argv[optind]);

    double t1 = wctime();
    int m = RUN(pfib, n);
    double t2 = wctime();

    printf("fib(%d) = %d\n", n, m);
    printf("Time: %f\n", t2-t1);

    lace_stop();
    return 0;
}